

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O0

size_type __thiscall
std::experimental::detail::
dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
::operator()(dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
             *this)

{
  value_type d;
  value_type s;
  value_type p;
  unsigned_long uVar1;
  size_type v1;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,2ul>
  local_1b;
  span_by_value local_1a;
  multiplies_by_value local_19;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
  *local_18;
  dims_ternary_reduction<std::experimental::detail::span_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_1UL,_2UL>
  *this_local;
  
  local_18 = this;
  d = dimensions<30UL,_1UL>::operator[]<unsigned_long>
                ((dimensions<30UL,_1UL> *)((long)&this_local + 7),1);
  s = dimensions<1UL,_1UL>::operator[]<unsigned_long>
                ((dimensions<1UL,_1UL> *)((long)&this_local + 6),1);
  p = dimensions<0UL,_0UL>::operator[]<unsigned_long>
                ((dimensions<0UL,_0UL> *)((long)&this_local + 5),1);
  uVar1 = span_by_value::operator()(&local_1a,d,s,p);
  v1 = dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,2ul>
       ::operator()(&local_1b);
  uVar1 = multiplies_by_value::operator()(&local_19,uVar1,v1);
  return uVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
      , dimensions<Dims1...> d1
      , dimensions<Dims2...> d2
        ) const noexcept
    {
        static_assert(
               dimensions<Dims0...>::rank() == dimensions<Dims1...>::rank()
            && dimensions<Dims0...>::rank() == dimensions<Dims2...>::rank()
          , "Arguments to ternary reduction have unequal rank"
        );
        static_assert(
               dimensions<Dims0...>::rank() == Size 
            || dimensions<Dims1...>::rank() == Size 
            || dimensions<Dims2...>::rank() == Size 
          , "Size not equal to rank of arguments"
        );

        return Reduction()(
            Op()(d0[Idx], d1[Idx], d2[Idx])
          , dims_ternary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0), std::move(d1), std::move(d2))
        );
    }